

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatawriter.cpp
# Opt level: O1

ssize_t icu_63::CollationDataWriter::write(int __fd,void *__buf,size_t __n)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  UChar *srcChars;
  UChar *srcChars_00;
  uint uVar4;
  char cVar5;
  void *data;
  byte bVar6;
  UBool UVar7;
  int iVar8;
  int32_t iVar9;
  int iVar10;
  UnicodeSet *this;
  long in_RCX;
  int iVar11;
  int iVar12;
  void *in_R8;
  undefined8 in_R9;
  ulong uVar13;
  uint length;
  int iVar14;
  int *in_stack_00000008;
  undefined2 *in_stack_00000010;
  int in_stack_00000018;
  UErrorCode *in_stack_00000020;
  UnicodeString scripts;
  UVector32 codesAndRanges;
  UnicodeSet unsafeBackwardSet;
  undefined2 *local_158;
  uint local_140;
  int32_t *local_138;
  UChar local_122;
  UnicodeString local_120;
  undefined8 *local_e0;
  void *local_d8;
  undefined8 local_d0;
  UChar *local_c8;
  UChar *local_b8;
  UVector32 local_a8;
  UnicodeSet local_88;
  
  local_140 = 0;
  if (U_ZERO_ERROR < *in_stack_00000020) goto LAB_0027b343;
  if ((in_stack_00000018 < 0) || (in_stack_00000010 == (undefined2 *)0x0 && in_stack_00000018 != 0))
  {
    *in_stack_00000020 = U_ILLEGAL_ARGUMENT_ERROR;
    local_140 = 0;
    goto LAB_0027b343;
  }
  cVar5 = (char)__fd;
  local_158 = in_stack_00000010;
  local_d8 = in_R8;
  local_d0 = in_R9;
  UnicodeSet::UnicodeSet(&local_88);
  lVar2 = *(long *)(__n + 0x20);
  lVar3 = *(long *)(__n + 0x58);
  if (cVar5 == '\0') {
    if (lVar2 != 0) {
      iVar14 = *(int *)(__n + 0x44);
      this = UnicodeSet::addAll(&local_88,*(UnicodeSet **)(__n + 0x50));
      UnicodeSet::removeAll(this,*(UnicodeSet **)(lVar2 + 0x50));
      UVar7 = UnicodeSet::isEmpty(&local_88);
      iVar11 = 0x10;
      if (UVar7 != '\0') {
        iVar11 = (uint)(iVar14 != 0) * 2 + 0xd;
      }
      if (*(long *)(__n + 0x58) == *(long *)(lVar2 + 0x58)) {
        iVar14 = 0;
      }
      else {
        iVar14 = *(int *)(__n + 0x60);
        iVar11 = 0x11;
      }
      goto LAB_0027acc8;
    }
    iVar11 = 8;
    if (*(int *)(in_RCX + 0x48) == 0) {
      iVar11 = 2;
    }
    bVar6 = 1;
    iVar14 = 0;
  }
  else {
    UnicodeSet::operator=(&local_88,*(UnicodeSet **)(__n + 0x50));
    iVar14 = *(int *)(__n + 0x60);
    iVar11 = 0x14;
LAB_0027acc8:
    bVar6 = 0;
  }
  UVector32::UVector32(&local_a8,in_stack_00000020);
  local_138 = *(int32_t **)(in_RCX + 0x40);
  length = *(uint *)(in_RCX + 0x48);
  if (*(uint8_t **)(in_RCX + 0x20) == (uint8_t *)0x0) {
LAB_0027ad88:
    if (cVar5 == '\0') {
      uVar4 = (uint)((char)iVar11 + (char)length & ~bVar6 & *(int *)(__n + 0x40) != 0) * 4;
      local_140 = uVar4 + 0x18;
      iVar8 = in_stack_00000018 - local_140;
      if (in_stack_00000018 < (int)local_140) {
        iVar8 = 0;
        local_158 = (undefined2 *)0x0;
      }
      else {
        uVar1 = *__buf;
        *in_stack_00000010 = (short)local_140;
        in_stack_00000010[1] = 0x27da;
        *(undefined8 *)(in_stack_00000010 + 2) = 0x2000000000014;
        *(undefined8 *)(in_stack_00000010 + 6) = 0x56c6f4355;
        *(undefined4 *)(in_stack_00000010 + 10) = uVar1;
        memset(in_stack_00000010 + 0xc,0,(ulong)uVar4);
        local_158 = (undefined2 *)((long)in_stack_00000010 + (ulong)local_140);
      }
    }
    else {
      local_140 = 0;
      iVar8 = in_stack_00000018;
    }
    *in_stack_00000008 = iVar11;
    in_stack_00000008[1] =
         (uint)(lVar3 != 0) << 0x11 | *(uint *)(__n + 0x38) | *(uint *)(in_RCX + 0x18);
    in_stack_00000008[2] = 0;
    in_stack_00000008[3] = 0;
    iVar10 = -1;
    if ((bVar6 == 0) && ((cVar5 != '\0' || (*(long *)(__n + 0x28) != *(long *)(lVar2 + 0x28))))) {
      iVar10 = (int)((ulong)(*(long *)(__n + 0x28) - *(long *)(__n + 8)) >> 2);
    }
    in_stack_00000008[4] = iVar10;
    in_stack_00000008[5] = iVar11 * 4;
    iVar10 = (length + iVar11) * 4;
    in_stack_00000008[6] = iVar10;
    iVar12 = (length + iVar11) * 4 + 0x100;
    if (*(long *)(in_RCX + 0x20) == 0) {
      iVar12 = iVar10;
    }
    in_stack_00000008[7] = iVar12;
    if (bVar6 == 0) {
      local_120.super_Replaceable.super_UObject._vptr_UObject =
           (UObject)((ulong)local_120.super_Replaceable.super_UObject._vptr_UObject &
                    0xffffffff00000000);
      iVar10 = iVar8 - iVar12;
      data = (void *)((long)iVar12 + (long)local_158);
      if (iVar8 - iVar12 == 0 || iVar8 < iVar12) {
        iVar10 = 0;
        data = (void *)0x0;
      }
      iVar9 = utrie2_serialize_63(*(UTrie2 **)__n,data,iVar10,(UErrorCode *)&local_120);
      if ((UErrorCode)local_120.super_Replaceable.super_UObject._vptr_UObject !=
          U_BUFFER_OVERFLOW_ERROR &&
          U_ZERO_ERROR < (UErrorCode)local_120.super_Replaceable.super_UObject._vptr_UObject) {
        *in_stack_00000020 = (UErrorCode)local_120.super_Replaceable.super_UObject._vptr_UObject;
        goto LAB_0027b17f;
      }
      iVar12 = iVar12 + iVar9;
    }
    in_stack_00000008[8] = iVar12;
    in_stack_00000008[9] = iVar12;
    if ((bVar6 == 0) && (*(int *)(__n + 0x40) != 0)) {
      iVar12 = iVar12 + *(int *)(__n + 0x40) * 8;
    }
    in_stack_00000008[10] = iVar12;
    in_stack_00000008[0xb] = iVar12;
    iVar10 = *(int *)(__n + 0x3c) << 2;
    if (bVar6 != 0) {
      iVar10 = 0;
    }
    in_stack_00000008[0xc] = iVar10 + iVar12;
    iVar12 = iVar10 + iVar12 + (int)local_d0 * 4;
    in_stack_00000008[0xd] = iVar12;
    iVar10 = *(int *)(__n + 0x44) * 2;
    if (bVar6 != 0) {
      iVar10 = 0;
    }
    iVar10 = iVar10 + iVar12;
    in_stack_00000008[0xe] = iVar10;
    if ((bVar6 == 0) && (UVar7 = UnicodeSet::isEmpty(&local_88), UVar7 == '\0')) {
      local_120.super_Replaceable.super_UObject._vptr_UObject =
           (UObject)((ulong)local_120.super_Replaceable.super_UObject._vptr_UObject &
                    0xffffffff00000000);
      if (iVar8 - iVar10 == 0 || iVar8 < iVar10) {
        iVar12 = UnicodeSet::serialize(&local_88,(uint16_t *)0x0,0,(UErrorCode *)&local_120);
      }
      else {
        iVar12 = UnicodeSet::serialize
                           (&local_88,(uint16_t *)((long)iVar10 + (long)local_158),
                            (iVar8 - iVar10) / 2,(UErrorCode *)&local_120);
      }
      if ((UErrorCode)local_120.super_Replaceable.super_UObject._vptr_UObject !=
          U_BUFFER_OVERFLOW_ERROR &&
          U_ZERO_ERROR < (UErrorCode)local_120.super_Replaceable.super_UObject._vptr_UObject) {
        *in_stack_00000020 = (UErrorCode)local_120.super_Replaceable.super_UObject._vptr_UObject;
        goto LAB_0027b17f;
      }
      iVar10 = iVar10 + iVar12 * 2;
    }
    in_stack_00000008[0xf] = iVar10;
    iVar10 = iVar10 + iVar14 * 2;
    local_120.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003c0258;
    local_120.fUnion.fStackFields.fLengthAndFlags = 2;
    in_stack_00000008[0x10] = iVar10;
    if (cVar5 != '\0') {
      local_122 = *(UChar *)(__n + 100);
      UnicodeString::doAppend(&local_120,&local_122,0,1);
      srcChars = *(UChar **)(__n + 0x68);
      UnicodeString::doAppend(&local_120,srcChars,0,*(int *)(__n + 100) + 0x10);
      srcChars_00 = *(UChar **)(__n + 0x70);
      local_b8 = srcChars;
      UnicodeString::doAppend(&local_120,srcChars_00,0,*(int32_t *)(__n + 0x78));
      if (-1 < local_120.fUnion.fStackFields.fLengthAndFlags) {
        local_120.fUnion.fFields.fLength = (int)local_120.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      iVar10 = iVar10 + local_120.fUnion.fFields.fLength * 2;
      local_c8 = srcChars_00;
    }
    iVar14 = iVar10 + 0x100;
    if (cVar5 == '\0') {
      iVar14 = iVar10;
    }
    in_stack_00000008[0x11] = iVar10;
    in_stack_00000008[0x12] = iVar14;
    in_stack_00000008[0x13] = iVar14;
    if (iVar8 < iVar14) {
      *in_stack_00000020 = U_BUFFER_OVERFLOW_ERROR;
    }
    else {
      memcpy(local_158,in_stack_00000008,(ulong)(uint)(iVar11 * 4));
      iVar11 = in_stack_00000008[5];
      if (iVar11 < in_stack_00000008[6]) {
        memcpy((void *)((long)iVar11 + (long)local_158),local_138,
               (long)(in_stack_00000008[6] - iVar11));
      }
      iVar11 = in_stack_00000008[6];
      if (iVar11 < in_stack_00000008[7]) {
        memcpy((void *)((long)iVar11 + (long)local_158),*(void **)(in_RCX + 0x20),
               (long)(in_stack_00000008[7] - iVar11));
      }
      iVar11 = in_stack_00000008[9];
      if (iVar11 < in_stack_00000008[10]) {
        memcpy((void *)((long)iVar11 + (long)local_158),*(void **)(__n + 0x10),
               (long)(in_stack_00000008[10] - iVar11));
      }
      iVar11 = in_stack_00000008[0xb];
      if (iVar11 < in_stack_00000008[0xc]) {
        memcpy((void *)((long)iVar11 + (long)local_158),*(void **)(__n + 8),
               (long)(in_stack_00000008[0xc] - iVar11));
      }
      iVar11 = in_stack_00000008[0xc];
      if (iVar11 < in_stack_00000008[0xd]) {
        memcpy((void *)((long)iVar11 + (long)local_158),local_d8,
               (long)(in_stack_00000008[0xd] - iVar11));
      }
      iVar11 = in_stack_00000008[0xd];
      if (iVar11 < in_stack_00000008[0xe]) {
        memcpy((void *)((long)iVar11 + (long)local_158),*(void **)(__n + 0x18),
               (long)(in_stack_00000008[0xe] - iVar11));
      }
      iVar11 = in_stack_00000008[0xf];
      if (iVar11 < in_stack_00000008[0x10]) {
        memcpy((void *)((long)iVar11 + (long)local_158),*(void **)(__n + 0x58),
               (long)(in_stack_00000008[0x10] - iVar11));
      }
      if ((local_120.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
        if ((local_120.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
          local_120.fUnion.fFields.fArray = (char16_t *)((long)&local_120.fUnion + 2);
        }
      }
      else {
        local_120.fUnion.fFields.fArray = (char16_t *)0x0;
      }
      iVar11 = in_stack_00000008[0x10];
      if (iVar11 < in_stack_00000008[0x11]) {
        memcpy((void *)((long)iVar11 + (long)local_158),local_120.fUnion.fFields.fArray,
               (long)(in_stack_00000008[0x11] - iVar11));
      }
      iVar11 = in_stack_00000008[0x11];
      if (iVar11 < in_stack_00000008[0x12]) {
        memcpy((void *)((long)local_158 + (long)iVar11),*(void **)(__n + 0x48),
               (long)(in_stack_00000008[0x12] - iVar11));
      }
    }
    local_140 = iVar14 + local_140;
    UnicodeString::~UnicodeString(&local_120);
  }
  else {
    UVar7 = CollationSettings::reorderTableHasSplitBytes(*(uint8_t **)(in_RCX + 0x20));
    if (UVar7 == '\0') goto LAB_0027ad88;
    CollationData::makeReorderRanges
              ((CollationData *)__n,local_138,length,&local_a8,in_stack_00000020);
    local_e0 = (undefined8 *)__n;
    if (0 < (int)length) {
      uVar13 = 0;
      do {
        UVector32::insertElementAt(&local_a8,local_138[uVar13],(int32_t)uVar13,in_stack_00000020);
        uVar13 = uVar13 + 1;
      } while (length != uVar13);
    }
    if (*in_stack_00000020 < U_ILLEGAL_ARGUMENT_ERROR) {
      local_138 = local_a8.elements;
      __n = (size_t)local_e0;
      length = local_a8.count;
      goto LAB_0027ad88;
    }
LAB_0027b17f:
    local_140 = 0;
  }
  UVector32::~UVector32(&local_a8);
  UnicodeSet::~UnicodeSet(&local_88);
LAB_0027b343:
  return (ulong)local_140;
}

Assistant:

int32_t
CollationDataWriter::write(UBool isBase, const UVersionInfo dataVersion,
                           const CollationData &data, const CollationSettings &settings,
                           const void *rootElements, int32_t rootElementsLength,
                           int32_t indexes[], uint8_t *dest, int32_t capacity,
                           UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    if(capacity < 0 || (capacity > 0 && dest == NULL)) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    // Figure out which data items to write before settling on
    // the indexes length and writing offsets.
    // For any data item, we need to write the start and limit offsets,
    // so the indexes length must be at least index-of-start-offset + 2.
    int32_t indexesLength;
    UBool hasMappings;
    UnicodeSet unsafeBackwardSet;
    const CollationData *baseData = data.base;

    int32_t fastLatinVersion;
    if(data.fastLatinTable != NULL) {
        fastLatinVersion = (int32_t)CollationFastLatin::VERSION << 16;
    } else {
        fastLatinVersion = 0;
    }
    int32_t fastLatinTableLength = 0;

    if(isBase) {
        // For the root collator, we write an even number of indexes
        // so that we start with an 8-aligned offset.
        indexesLength = CollationDataReader::IX_TOTAL_SIZE + 1;
        U_ASSERT(settings.reorderCodesLength == 0);
        hasMappings = TRUE;
        unsafeBackwardSet = *data.unsafeBackwardSet;
        fastLatinTableLength = data.fastLatinTableLength;
    } else if(baseData == NULL) {
        hasMappings = FALSE;
        if(settings.reorderCodesLength == 0) {
            // only options
            indexesLength = CollationDataReader::IX_OPTIONS + 1;  // no limit offset here
        } else {
            // only options, reorder codes, and the reorder table
            indexesLength = CollationDataReader::IX_REORDER_TABLE_OFFSET + 2;
        }
    } else {
        hasMappings = TRUE;
        // Tailored mappings, and what else?
        // Check in ascending order of optional tailoring data items.
        indexesLength = CollationDataReader::IX_CE32S_OFFSET + 2;
        if(data.contextsLength != 0) {
            indexesLength = CollationDataReader::IX_CONTEXTS_OFFSET + 2;
        }
        unsafeBackwardSet.addAll(*data.unsafeBackwardSet).removeAll(*baseData->unsafeBackwardSet);
        if(!unsafeBackwardSet.isEmpty()) {
            indexesLength = CollationDataReader::IX_UNSAFE_BWD_OFFSET + 2;
        }
        if(data.fastLatinTable != baseData->fastLatinTable) {
            fastLatinTableLength = data.fastLatinTableLength;
            indexesLength = CollationDataReader::IX_FAST_LATIN_TABLE_OFFSET + 2;
        }
    }

    UVector32 codesAndRanges(errorCode);
    const int32_t *reorderCodes = settings.reorderCodes;
    int32_t reorderCodesLength = settings.reorderCodesLength;
    if(settings.hasReordering() &&
            CollationSettings::reorderTableHasSplitBytes(settings.reorderTable)) {
        // Rebuild the full list of reorder ranges.
        // The list in the settings is truncated for efficiency.
        data.makeReorderRanges(reorderCodes, reorderCodesLength, codesAndRanges, errorCode);
        // Write the codes, then the ranges.
        for(int32_t i = 0; i < reorderCodesLength; ++i) {
            codesAndRanges.insertElementAt(reorderCodes[i], i, errorCode);
        }
        if(U_FAILURE(errorCode)) { return 0; }
        reorderCodes = codesAndRanges.getBuffer();
        reorderCodesLength = codesAndRanges.size();
    }

    int32_t headerSize;
    if(isBase) {
        headerSize = 0;  // udata_create() writes the header
    } else {
        DataHeader header;
        header.dataHeader.magic1 = 0xda;
        header.dataHeader.magic2 = 0x27;
        uprv_memcpy(&header.info, &dataInfo, sizeof(UDataInfo));
        uprv_memcpy(header.info.dataVersion, dataVersion, sizeof(UVersionInfo));
        headerSize = (int32_t)sizeof(header);
        U_ASSERT((headerSize & 3) == 0);  // multiple of 4 bytes
        if(hasMappings && data.cesLength != 0) {
            // Sum of the sizes of the data items which are
            // not automatically multiples of 8 bytes and which are placed before the CEs.
            int32_t sum = headerSize + (indexesLength + reorderCodesLength) * 4;
            if((sum & 7) != 0) {
                // We need to add padding somewhere so that the 64-bit CEs are 8-aligned.
                // We add to the header size here.
                // Alternatively, we could increment the indexesLength
                // or add a few bytes to the reorderTable.
                headerSize += 4;
            }
        }
        header.dataHeader.headerSize = (uint16_t)headerSize;
        if(headerSize <= capacity) {
            uprv_memcpy(dest, &header, sizeof(header));
            // Write 00 bytes so that the padding is not mistaken for a copyright string.
            uprv_memset(dest + sizeof(header), 0, headerSize - (int32_t)sizeof(header));
            dest += headerSize;
            capacity -= headerSize;
        } else {
            dest = NULL;
            capacity = 0;
        }
    }

    indexes[CollationDataReader::IX_INDEXES_LENGTH] = indexesLength;
    U_ASSERT((settings.options & ~0xffff) == 0);
    indexes[CollationDataReader::IX_OPTIONS] =
            data.numericPrimary | fastLatinVersion | settings.options;
    indexes[CollationDataReader::IX_RESERVED2] = 0;
    indexes[CollationDataReader::IX_RESERVED3] = 0;

    // Byte offsets of data items all start from the start of the indexes.
    // We add the headerSize at the very end.
    int32_t totalSize = indexesLength * 4;

    if(hasMappings && (isBase || data.jamoCE32s != baseData->jamoCE32s)) {
        indexes[CollationDataReader::IX_JAMO_CE32S_START] = static_cast<int32_t>(data.jamoCE32s - data.ce32s);
    } else {
        indexes[CollationDataReader::IX_JAMO_CE32S_START] = -1;
    }

    indexes[CollationDataReader::IX_REORDER_CODES_OFFSET] = totalSize;
    totalSize += reorderCodesLength * 4;

    indexes[CollationDataReader::IX_REORDER_TABLE_OFFSET] = totalSize;
    if(settings.reorderTable != NULL) {
        totalSize += 256;
    }

    indexes[CollationDataReader::IX_TRIE_OFFSET] = totalSize;
    if(hasMappings) {
        UErrorCode errorCode2 = U_ZERO_ERROR;
        int32_t length;
        if(totalSize < capacity) {
            length = utrie2_serialize(data.trie, dest + totalSize,
                                      capacity - totalSize, &errorCode2);
        } else {
            length = utrie2_serialize(data.trie, NULL, 0, &errorCode2);
        }
        if(U_FAILURE(errorCode2) && errorCode2 != U_BUFFER_OVERFLOW_ERROR) {
            errorCode = errorCode2;
            return 0;
        }
        // The trie size should be a multiple of 8 bytes due to the way
        // compactIndex2(UNewTrie2 *trie) currently works.
        U_ASSERT((length & 7) == 0);
        totalSize += length;
    }

    indexes[CollationDataReader::IX_RESERVED8_OFFSET] = totalSize;
    indexes[CollationDataReader::IX_CES_OFFSET] = totalSize;
    if(hasMappings && data.cesLength != 0) {
        U_ASSERT(((headerSize + totalSize) & 7) == 0);
        totalSize += data.cesLength * 8;
    }

    indexes[CollationDataReader::IX_RESERVED10_OFFSET] = totalSize;
    indexes[CollationDataReader::IX_CE32S_OFFSET] = totalSize;
    if(hasMappings) {
        totalSize += data.ce32sLength * 4;
    }

    indexes[CollationDataReader::IX_ROOT_ELEMENTS_OFFSET] = totalSize;
    totalSize += rootElementsLength * 4;

    indexes[CollationDataReader::IX_CONTEXTS_OFFSET] = totalSize;
    if(hasMappings) {
        totalSize += data.contextsLength * 2;
    }

    indexes[CollationDataReader::IX_UNSAFE_BWD_OFFSET] = totalSize;
    if(hasMappings && !unsafeBackwardSet.isEmpty()) {
        UErrorCode errorCode2 = U_ZERO_ERROR;
        int32_t length;
        if(totalSize < capacity) {
            uint16_t *p = reinterpret_cast<uint16_t *>(dest + totalSize);
            length = unsafeBackwardSet.serialize(
                    p, (capacity - totalSize) / 2, errorCode2);
        } else {
            length = unsafeBackwardSet.serialize(NULL, 0, errorCode2);
        }
        if(U_FAILURE(errorCode2) && errorCode2 != U_BUFFER_OVERFLOW_ERROR) {
            errorCode = errorCode2;
            return 0;
        }
        totalSize += length * 2;
    }

    indexes[CollationDataReader::IX_FAST_LATIN_TABLE_OFFSET] = totalSize;
    totalSize += fastLatinTableLength * 2;

    UnicodeString scripts;
    indexes[CollationDataReader::IX_SCRIPTS_OFFSET] = totalSize;
    if(isBase) {
        scripts.append((UChar)data.numScripts);
        scripts.append(reinterpret_cast<const UChar *>(data.scriptsIndex), data.numScripts + 16);
        scripts.append(reinterpret_cast<const UChar *>(data.scriptStarts), data.scriptStartsLength);
        totalSize += scripts.length() * 2;
    }

    indexes[CollationDataReader::IX_COMPRESSIBLE_BYTES_OFFSET] = totalSize;
    if(isBase) {
        totalSize += 256;
    }

    indexes[CollationDataReader::IX_RESERVED18_OFFSET] = totalSize;
    indexes[CollationDataReader::IX_TOTAL_SIZE] = totalSize;

    if(totalSize > capacity) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return headerSize + totalSize;
    }

    uprv_memcpy(dest, indexes, indexesLength * 4);
    copyData(indexes, CollationDataReader::IX_REORDER_CODES_OFFSET, reorderCodes, dest);
    copyData(indexes, CollationDataReader::IX_REORDER_TABLE_OFFSET, settings.reorderTable, dest);
    // The trie has already been serialized into the dest buffer.
    copyData(indexes, CollationDataReader::IX_CES_OFFSET, data.ces, dest);
    copyData(indexes, CollationDataReader::IX_CE32S_OFFSET, data.ce32s, dest);
    copyData(indexes, CollationDataReader::IX_ROOT_ELEMENTS_OFFSET, rootElements, dest);
    copyData(indexes, CollationDataReader::IX_CONTEXTS_OFFSET, data.contexts, dest);
    // The unsafeBackwardSet has already been serialized into the dest buffer.
    copyData(indexes, CollationDataReader::IX_FAST_LATIN_TABLE_OFFSET, data.fastLatinTable, dest);
    copyData(indexes, CollationDataReader::IX_SCRIPTS_OFFSET, scripts.getBuffer(), dest);
    copyData(indexes, CollationDataReader::IX_COMPRESSIBLE_BYTES_OFFSET, data.compressibleBytes, dest);

    return headerSize + totalSize;
}